

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::BuilderTest_build_gauge_Test::TestBody
          (BuilderTest_build_gauge_Test *this)

{
  Builder<prometheus::Gauge> *pBVar1;
  Family<prometheus::Gauge> *this_00;
  Builder<prometheus::Gauge> local_80;
  
  BuildGauge();
  pBVar1 = detail::Builder<prometheus::Gauge>::Name(&local_80,&(this->super_BuilderTest).name);
  pBVar1 = detail::Builder<prometheus::Gauge>::Help(pBVar1,&(this->super_BuilderTest).help);
  pBVar1 = detail::Builder<prometheus::Gauge>::Labels
                     (pBVar1,&(this->super_BuilderTest).const_labels);
  this_00 = detail::Builder<prometheus::Gauge>::Register(pBVar1,&(this->super_BuilderTest).registry)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.help_._M_dataplus._M_p != &local_80.help_.field_2) {
    operator_delete(local_80.help_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.name_._M_dataplus._M_p != &local_80.name_.field_2) {
    operator_delete(local_80.name_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_80);
  Family<prometheus::Gauge>::Add<>(this_00,&(this->super_BuilderTest).more_labels);
  BuilderTest::verifyCollectedLabels(&this->super_BuilderTest);
  return;
}

Assistant:

TEST_F(BuilderTest, build_gauge) {
  auto& family = BuildGauge()
                     .Name(name)
                     .Help(help)
                     .Labels(const_labels)
                     .Register(registry);
  family.Add(more_labels);

  verifyCollectedLabels();
}